

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::IsUnsignedIntScalarOrVectorType
          (ValidationState_t *this,uint32_t id)

{
  uint16_t uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t id_00;
  Instruction *this_00;
  
  this_00 = FindDef(this,id);
  if (this_00 != (Instruction *)0x0) {
    uVar1 = (this_00->inst_).opcode;
    if (uVar1 == 0x17) {
      id_00 = GetComponentType(this,id);
      bVar2 = IsUnsignedIntScalarType(this,id_00);
      return bVar2;
    }
    if (uVar1 == 0x15) {
      uVar3 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
      return uVar3 == 0;
    }
  }
  return false;
}

Assistant:

bool ValidationState_t::IsUnsignedIntScalarOrVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeInt) {
    return inst->GetOperandAs<uint32_t>(2) == 0;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsUnsignedIntScalarType(GetComponentType(id));
  }

  return false;
}